

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMDocumentImpl.cpp
# Opt level: O2

void __thiscall xercesc_4_0::DOMDocumentImpl::~DOMDocumentImpl(DOMDocumentImpl *this)

{
  RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
  *this_00;
  RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_> *this_01;
  XMemory *this_02;
  DOMNormalizer *this_03;
  EVP_PKEY_CTX *in_RSI;
  
  (this->super_DOMMemoryManager)._vptr_DOMMemoryManager =
       (_func_int **)&PTR__DOMDocumentImpl_003fc540;
  (this->super_DOMDocument).super_DOMDocumentRange._vptr_DOMDocumentRange =
       (_func_int **)&DAT_003fc878;
  (this->super_DOMDocument).super_DOMXPathEvaluator._vptr_DOMXPathEvaluator =
       (_func_int **)&PTR__DOMDocumentImpl_003fc9c0;
  (this->super_DOMDocument).super_DOMDocumentTraversal._vptr_DOMDocumentTraversal =
       (_func_int **)&PTR__DOMDocumentImpl_003fc9f8;
  (this->super_DOMDocument).super_DOMNode._vptr_DOMNode =
       (_func_int **)&PTR__DOMDocumentImpl_003fca28;
  (this->super_HasDOMNodeImpl)._vptr_HasDOMNodeImpl = (_func_int **)&PTR__DOMDocumentImpl_003fcb78;
  (this->super_HasDOMParentImpl)._vptr_HasDOMParentImpl =
       (_func_int **)&PTR__DOMDocumentImpl_003fcba8;
  if (this->fDOMConfiguration != (DOMConfiguration *)0x0) {
    (*this->fDOMConfiguration->_vptr_DOMConfiguration[6])();
  }
  if (this->fNodeListPool !=
      (DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher> *)0x0) {
    DOMDeepNodeListPool<xercesc_4_0::DOMDeepNodeListImpl,_xercesc_4_0::PtrHasher>::cleanup
              (this->fNodeListPool,in_RSI);
  }
  if (this->fRanges != (Ranges *)0x0) {
    (*(this->fRanges->super_BaseRefVectorOf<xercesc_4_0::DOMRangeImpl>)._vptr_BaseRefVectorOf[1])();
  }
  if (this->fNodeIterators != (NodeIterators *)0x0) {
    (*(this->fNodeIterators->super_BaseRefVectorOf<xercesc_4_0::DOMNodeIteratorImpl>).
      _vptr_BaseRefVectorOf[1])();
  }
  this_00 = this->fUserDataTable;
  if (this_00 !=
      (RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
       *)0x0) {
    RefHash2KeysTableOf<xercesc_4_0::KeyRefPair<void,_xercesc_4_0::DOMUserDataHandler>,_xercesc_4_0::PtrHasher>
    ::~RefHash2KeysTableOf(this_00);
    XMemory::operator_delete((XMemory *)this_00,in_RSI);
  }
  if (this->fRecycleNodePtr != (RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_> *)0x0) {
    RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_>::deleteAllElements
              (this->fRecycleNodePtr);
    this_01 = this->fRecycleNodePtr;
    if (this_01 != (RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_> *)0x0) {
      RefArrayOf<xercesc_4_0::RefStackOf<xercesc_4_0::DOMNode>_>::~RefArrayOf(this_01);
    }
    XMemory::operator_delete((XMemory *)this_01,in_RSI);
  }
  this_02 = (XMemory *)this->fRecycleBufferPtr;
  if (this_02 != (XMemory *)0x0) {
    RefVectorOf<xercesc_4_0::DOMBuffer>::~RefVectorOf
              ((RefVectorOf<xercesc_4_0::DOMBuffer> *)(this_02 + 8));
    XMemory::operator_delete(this_02,in_RSI);
  }
  this_03 = this->fNormalizer;
  if (this_03 != (DOMNormalizer *)0x0) {
    DOMNormalizer::~DOMNormalizer(this_03);
  }
  XMemory::operator_delete((XMemory *)this_03,in_RSI);
  deleteHeap(this);
  XMLStringPool::~XMLStringPool(&this->fUserDataTableKeys);
  DOMParentNode::~DOMParentNode(&this->fParent);
  DOMNodeImpl::~DOMNodeImpl(&this->fNode);
  return;
}

Assistant:

DOMDocumentImpl::~DOMDocumentImpl()
{
    // While DOMConfiguration is allocated on the Document's heap, itself
    // it uses the memory manager directly. This means that while we cannot
    // delete with operator delete, we need to call its d-tor.
    //
    if (fDOMConfiguration)
      fDOMConfiguration->~DOMConfiguration ();

    //  Clean up the fNodeListPool
    if (fNodeListPool)
        fNodeListPool->cleanup();

    if (fRanges)
        delete fRanges; //fRanges->cleanup();

    if (fNodeIterators)
        delete fNodeIterators;//fNodeIterators->cleanup();

    if (fUserDataTable)
        delete fUserDataTable;//fUserDataTable->cleanup();

    if (fRecycleNodePtr) {
        fRecycleNodePtr->deleteAllElements();
        delete fRecycleNodePtr;
    }

    if (fRecycleBufferPtr) {
        delete fRecycleBufferPtr;
    }

    delete fNormalizer;

    //  Delete the heap for this document.  This uncerimoniously yanks the storage
    //      out from under all of the nodes in the document.  Destructors are NOT called.
    this->deleteHeap();
}